

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nng.c
# Opt level: O0

int nng_listener_get_url(nng_listener id,nng_url **urlp)

{
  nng_url *pnVar1;
  nni_listener *local_28;
  nni_listener *l;
  nng_url **ppnStack_18;
  int rv;
  nng_url **urlp_local;
  nng_listener id_local;
  
  ppnStack_18 = urlp;
  urlp_local._0_4_ = id.id;
  l._4_4_ = nni_listener_find(&local_28,id.id);
  urlp_local._4_4_ = l._4_4_;
  if (l._4_4_ == 0) {
    pnVar1 = nni_listener_url(local_28);
    *ppnStack_18 = pnVar1;
    nni_listener_rele(local_28);
    urlp_local._4_4_ = 0;
  }
  return urlp_local._4_4_;
}

Assistant:

int
nng_listener_get_url(nng_listener id, const nng_url **urlp)
{
	int           rv;
	nni_listener *l;
	if ((rv = nni_listener_find(&l, id.id)) != 0) {
		return (rv);
	}
	*urlp = nni_listener_url(l);
	nni_listener_rele(l);
	return (0);
}